

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_menu_begin_text(nk_context *ctx,char *title,int len,nk_flags align,nk_vec2 size)

{
  nk_vec2 size_00;
  nk_rect bounds;
  nk_rect header_00;
  nk_widget_layout_states align_00;
  int iVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  float in_ESI;
  nk_flags *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  nk_user_font *unaff_retaddr;
  nk_flags state;
  int is_clicked;
  nk_rect header;
  nk_input *in;
  nk_window *win;
  nk_context *in_stack_ffffffffffffff70;
  nk_rect *in_stack_ffffffffffffff78;
  nk_button_behavior in_stack_ffffffffffffffac;
  int iVar2;
  nk_window *in_stack_ffffffffffffffb8;
  nk_context *in_stack_ffffffffffffffc0;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar2 = 0;
  if (((in_RDI == (nk_flags *)0x0) || (*(long *)(in_RDI + 0xff2) == 0)) ||
     (*(long *)(*(long *)(in_RDI + 0xff2) + 0xa0) == 0)) {
    iVar2 = 0;
  }
  else {
    fVar4 = (float)*(undefined8 *)(in_RDI + 0xff2);
    uVar5 = (undefined4)((ulong)*(undefined8 *)(in_RDI + 0xff2) >> 0x20);
    align_00 = nk_widget(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    if (align_00 == NK_WIDGET_INVALID) {
      iVar2 = 0;
    }
    else {
      if ((align_00 == NK_WIDGET_ROM) || ((*(uint *)(CONCAT44(uVar5,fVar4) + 0x48) & 0x800) != 0)) {
        in_RDI = (nk_flags *)0x0;
      }
      fVar3 = (float)((ulong)in_RDI >> 0x20);
      bounds.y = (float)in_ECX;
      bounds.x = (float)uVar5;
      bounds.w = (float)in_EDX;
      bounds.h = in_ESI;
      iVar1 = nk_do_button_text(in_RDI,(nk_command_buffer *)in_stack_ffffffffffffffc0,bounds,
                                (char *)in_stack_ffffffffffffffb8,iVar2,align_00,
                                in_stack_ffffffffffffffac,
                                (nk_style_button *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff0),
                                (nk_input *)CONCAT44(in_stack_fffffffffffffffc,in_XMM0_Db),
                                unaff_retaddr);
      if (iVar1 != 0) {
        iVar2 = 1;
      }
      header_00.y = (float)in_ECX;
      header_00.x = (float)uVar5;
      header_00.w = (float)in_EDX;
      header_00.h = in_ESI;
      size_00.y = fVar4;
      size_00.x = fVar3;
      iVar2 = nk_menu_begin(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                            (char *)CONCAT44(iVar2,align_00),in_stack_ffffffffffffffac,header_00,
                            size_00);
    }
  }
  return iVar2;
}

Assistant:

NK_API int
nk_menu_begin_text(struct nk_context *ctx, const char *title, int len,
    nk_flags align, struct nk_vec2 size)
{
    struct nk_window *win;
    const struct nk_input *in;
    struct nk_rect header;
    int is_clicked = nk_false;
    nk_flags state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    state = nk_widget(&header, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || win->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    if (nk_do_button_text(&ctx->last_widget_state, &win->buffer, header,
        title, len, align, NK_BUTTON_DEFAULT, &ctx->style.menu_button, in, ctx->style.font))
        is_clicked = nk_true;
    return nk_menu_begin(ctx, win, title, is_clicked, header, size);
}